

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaDevice.cpp
# Opt level: O0

void __thiscall
xmrig::CudaDevice::CudaDevice(CudaDevice *this,uint32_t index,int32_t bfactor,int32_t bsleep)

{
  int iVar1;
  DeviceProperty property;
  uint32_t device;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  nvid_ctx *ctx;
  int32_t in_stack_ffffffffffffffb8;
  DeviceProperty in_stack_ffffffffffffffbc;
  String *this_00;
  PciTopology local_30 [4];
  nvid_ctx *local_20;
  
  *in_RDI = in_ESI;
  *(undefined8 *)(in_RDI + 2) = 0;
  PciTopology::PciTopology((PciTopology *)(in_RDI + 4));
  this_00 = (String *)(in_RDI + 6);
  String::String(this_00);
  *(undefined8 *)(in_RDI + 10) = 0;
  local_20 = CudaLib::alloc((uint32_t)((ulong)this_00 >> 0x20),(int32_t)this_00,
                            in_stack_ffffffffffffffbc);
  iVar1 = CudaLib::deviceInfo((nvid_ctx *)this_00,in_stack_ffffffffffffffbc,
                              in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    *(nvid_ctx **)(in_RDI + 2) = local_20;
    CudaLib::deviceName((nvid_ctx *)this_00);
    String::operator=(this_00,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
    ;
    property = CudaLib::deviceUint((nvid_ctx *)this_00,in_stack_ffffffffffffffbc);
    device = CudaLib::deviceUint((nvid_ctx *)this_00,property);
    PciTopology::PciTopology(local_30,property,device,0);
    *(PciTopology *)(in_RDI + 4) = local_30[0];
  }
  else {
    CudaLib::release((nvid_ctx *)0x229c89);
  }
  return;
}

Assistant:

xmrig::CudaDevice::CudaDevice(uint32_t index, int32_t bfactor, int32_t bsleep) :
    m_index(index)
{
    auto ctx = CudaLib::alloc(index, bfactor, bsleep);
    if (CudaLib::deviceInfo(ctx, 0, 0) != 0) {
        CudaLib::release(ctx);

        return;
    }

    m_ctx       = ctx;
    m_name      = CudaLib::deviceName(ctx);
    m_topology  = PciTopology(CudaLib::deviceUint(ctx, CudaLib::DevicePciBusID), CudaLib::deviceUint(ctx, CudaLib::DevicePciDeviceID), 0);
}